

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O1

int process_events_stone(CManager_conflict cm,int s,action_class c)

{
  int *piVar1;
  action_value aVar2;
  int iVar3;
  event_path_data evp;
  queue_item *pqVar4;
  FILE *pFVar5;
  attr_list p_Var6;
  _proto_action *p_Var7;
  EVImmediateHandlerFunc p_Var8;
  _event_path_data *p_Var9;
  bool bVar10;
  int iVar11;
  int iVar12;
  __pid_t _Var13;
  stone_type stone;
  stone_type p_Var14;
  event_item *peVar15;
  event_item *peVar16;
  CManager_conflict p_Var17;
  queue_item *pqVar18;
  pthread_t pVar19;
  FMFormat p_Var20;
  queue_item *pqVar21;
  response_cache_element *prVar22;
  long lVar23;
  proto_action *act;
  ev_handler_activation_ptr rec;
  char *pcVar24;
  CManager_conflict p_Var25;
  event_path_data evp_00;
  char *in_R8;
  int iVar26;
  bool bVar27;
  timespec ts;
  timespec ts_3;
  void *local_c0;
  int local_b4;
  response_cache_element *local_a8;
  _ev_handler_activation_rec local_80;
  timespec local_60;
  FMFormat local_50;
  int *local_48;
  long local_40;
  queue_item *local_38;
  
  iVar11 = 0;
  local_b4 = 0;
  if (s != -1) {
    evp = cm->evp;
    local_48 = (int *)evp->as;
    if (*local_48 == s) {
      *local_48 = -1;
    }
    stone = stone_struct(evp,s);
    local_b4 = iVar11;
    if ((stone != (stone_type)0x0) && (stone->queue_size != 0)) {
      iVar11 = CMtrace_val[10];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar11 = CMtrace_init(cm,EVerbose);
      }
      if (iVar11 != 0) {
        fwrite("Considering events on ",0x16,1,(FILE *)cm->CMTrace_file);
        fprint_stone_identifier(cm->CMTrace_file,evp,s);
        fputc(10,(FILE *)cm->CMTrace_file);
      }
      if (((stone->local_id != -1) && (stone->is_draining != 2)) && (stone->is_frozen != 1)) {
        iVar11 = 0;
        if ((c == Immediate_and_Multi) && (iVar11 = 0, stone->pending_output != 0)) {
          iVar11 = process_stone_pending_output(cm,s);
        }
        p_Var14 = stone_struct(cm->evp,s);
        iVar26 = 0;
        local_b4 = 0;
        if ((long)p_Var14->default_action == -1) {
          bVar27 = false;
        }
        else {
          bVar27 = p_Var14->proto_actions[p_Var14->default_action].action_type == Action_Bridge;
        }
        if ((c == Bridge) || (!bVar27)) {
          iVar12 = CMtrace_val[10];
          if (cm->CMTrace_file == (FILE *)0x0) {
            iVar12 = CMtrace_init(cm,EVerbose);
          }
          if (iVar12 != 0) {
            fwrite("Process events ",0xf,1,(FILE *)cm->CMTrace_file);
            fprint_stone_identifier(cm->CMTrace_file,evp,s);
            fputc(10,(FILE *)cm->CMTrace_file);
          }
          pqVar18 = stone->queue->queue_head;
          iVar12 = is_bridge_stone(cm,s);
          if ((c == Bridge) && (iVar12 != 0)) {
            stone->is_processing = 1;
            do_bridge_action(cm,s);
            stone->is_processing = 0;
          }
          else {
            local_b4 = iVar11;
            if (pqVar18 == (queue_item *)0x0) {
              bVar27 = true;
            }
            else {
              bVar27 = false;
              do {
                if ((stone->is_draining != 0) || (stone->is_frozen != 0)) break;
                pqVar4 = pqVar18->next;
                iVar11 = 2;
                pqVar21 = pqVar4;
                if (pqVar18->handled != 0) goto LAB_0013412c;
                peVar15 = pqVar18->item;
                iVar11 = determine_action(cm,stone,c,peVar15,(int)in_R8);
                if (stone->response_cache_count <= iVar11) {
                  __assert_fail("resp_id < stone->response_cache_count",
                                "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                                ,0x6d0,"int process_events_stone(CManager, int, action_class)");
                }
                if ((c == Immediate_and_Multi) &&
                   (stone->response_cache[iVar11].action_type == Action_NoAction)) {
                  if (peVar15->reference_format == (FMFormat)0x0) {
                    local_c0 = (void *)0x0;
                  }
                  else {
                    local_c0 = (void *)global_name_of_FMFormat();
                  }
                  printf("No action found for event %p submitted to \n",peVar15);
                  fprint_stone_identifier(_stdout,evp,s);
                  putchar(10);
                  p_Var14 = stone_struct(evp,s);
                  fdump_stone(_stdout,p_Var14);
                  pcVar24 = "    Unhandled incoming event format was NULL";
                  if (local_c0 == (void *)0x0) {
LAB_00133c2e:
                    puts(pcVar24);
                  }
                  else {
                    printf("    Unhandled incoming event format was \"%s\"\n",local_c0);
                    if (process_events_stone_first == '\0') {
                      process_events_stone_first = '\x01';
                      pcVar24 = 
                      "\n\t** use \"format_info <format_name>\" to get full format information ** \n"
                      ;
                      goto LAB_00133c2e;
                    }
                  }
                  if (local_c0 != (void *)0x0) {
                    free(local_c0);
                  }
                  p_Var17 = cm;
                  peVar15 = dequeue_item(cm,stone,pqVar18);
                  return_event((event_path_data)p_Var17,peVar15);
                }
                local_a8 = stone->response_cache + iVar11;
                if (stone->response_cache[iVar11].action_type == Action_Decode) {
                  if (peVar15->event_encoded == 0) {
                    iVar12 = CMtrace_val[10];
                    if (cm->CMTrace_file == (FILE *)0x0) {
                      iVar12 = CMtrace_init(cm,EVerbose);
                    }
                    if (iVar12 != 0) {
                      if (CMtrace_PID != 0) {
                        pFVar5 = (FILE *)cm->CMTrace_file;
                        _Var13 = getpid();
                        pthread_self();
                        fprintf(pFVar5,"P%lxT%lx - ",(long)_Var13);
                      }
                      if (CMtrace_timing != 0) {
                        clock_gettime(1,(timespec *)&local_80);
                        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_80.prev);
                      }
                      fprintf((FILE *)cm->CMTrace_file,
                              "Encoding event prior to decode for conversion, action id %d\n",iVar11
                             );
                    }
                    fflush((FILE *)cm->CMTrace_file);
                    p_Var17 = cm;
                    peVar16 = reassign_memory_event(cm,peVar15,0);
                    return_event((event_path_data)p_Var17,peVar16);
                    peVar15->ref_count = peVar15->ref_count + 1;
                  }
                  iVar12 = CMtrace_val[10];
                  if (cm->CMTrace_file == (FILE *)0x0) {
                    iVar12 = CMtrace_init(cm,EVerbose);
                  }
                  if (iVar12 != 0) {
                    if (CMtrace_PID != 0) {
                      pFVar5 = (FILE *)cm->CMTrace_file;
                      _Var13 = getpid();
                      pthread_self();
                      fprintf(pFVar5,"P%lxT%lx - ",(long)_Var13);
                    }
                    if (CMtrace_timing != 0) {
                      clock_gettime(1,(timespec *)&local_80);
                      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_80.prev);
                    }
                    fprintf((FILE *)cm->CMTrace_file,"Decoding event, action id %d\n",iVar11);
                  }
                  fflush((FILE *)cm->CMTrace_file);
                  peVar16 = decode_action(cm,peVar15,local_a8);
                  if (peVar16 != (event_item *)0x0) {
                    pqVar18->item = peVar16;
                    iVar11 = determine_action(cm,stone,c,peVar16,(int)in_R8);
                    local_a8 = stone->response_cache + iVar11;
                    goto LAB_00133eb4;
                  }
                  prVar22 = (response_cache_element *)0x0;
                  bVar10 = false;
                  iVar26 = local_b4;
                }
                else {
LAB_00133eb4:
                  iVar12 = CMtrace_val[10];
                  if (cm->CMTrace_file == (FILE *)0x0) {
                    iVar12 = CMtrace_init(cm,EVerbose);
                  }
                  if (iVar12 != 0) {
                    fprintf((FILE *)cm->CMTrace_file,"next action event %p on ",peVar15);
                    fprint_stone_identifier(cm->CMTrace_file,evp,s);
                    pFVar5 = (FILE *)cm->CMTrace_file;
                    pcVar24 = action_str[local_a8->action_type];
                    p_Var20 = local_a8->reference_format;
                    in_R8 = "<none>";
                    if (p_Var20 != (FMFormat)0x0) {
                      local_50 = p_Var20;
                      in_R8 = (char *)global_name_of_FMFormat(p_Var20,local_a8,pcVar24);
                      p_Var20 = local_50;
                    }
                    fprintf(pFVar5,
                            " action type is %s, reference_format is %p (%s), stage is %d, requires_decoded is %d\n"
                            ,pcVar24,p_Var20,in_R8,(ulong)local_a8->stage,local_a8->requires_decoded
                           );
                    fdump_action(cm->CMTrace_file,stone,local_a8,local_a8->proto_action_id,in_R8);
                  }
                  prVar22 = stone->response_cache + iVar11;
                  bVar10 = true;
                }
                iVar11 = 1;
                pqVar21 = pqVar18;
                if (!bVar10) goto LAB_0013412c;
                backpressure_check(cm,s);
                iVar11 = 0;
                if (((prVar22->stage != c) &&
                    (pqVar21 = pqVar4, c != Immediate_and_Multi || prVar22->stage != Immediate)) ||
                   (aVar2 = prVar22->action_type, pqVar21 = pqVar4, Action_Congestion < aVar2))
                goto LAB_0013412c;
                if ((0x63cU >> (aVar2 & 0x1f) & 1) == 0) {
                  if ((0x840U >> (aVar2 & 0x1f) & 1) != 0) {
                    iVar11 = 3;
                    pqVar21 = pqVar18;
                    if ((stone->new_enqueue_flag != 0) && (iVar11 = 3, pqVar18->handled == 0)) {
                      stone->is_processing = 1;
                      pqVar18->handled = 1;
                      in_R8 = (char *)(ulong)(uint)stone->output_count;
                      iVar12 = (*(prVar22->o).imm.handler)
                                         (cm,(_event_item *)stone->queue,pqVar18,
                                          (attr_list)(prVar22->o).decode.target_reference_format,
                                          stone->output_count,stone->output_stone_ids);
                      bVar27 = true;
                      local_b4 = (local_b4 + 1) - (uint)(iVar12 == 0);
                      stone = stone_struct(cm->evp,s);
                      stone->is_processing = 0;
                    }
                  }
                  goto LAB_0013412c;
                }
                p_Var17 = (CManager_conflict)dequeue_item(cm,stone,pqVar18);
                switch(prVar22->action_type) {
                case Action_Thread_Bridge:
                  p_Var7 = stone->proto_actions;
                  iVar12 = prVar22->proto_action_id;
                  iVar11 = 2;
                  pqVar21 = pqVar18;
                  if (p_Var7[iVar12].o.term.target_stone_id != 0) goto LAB_0013412c;
                  thread_bridge_transfer
                            (cm,(event_item *)p_Var17,p_Var7[iVar12].o.thr_bri.target_cm,
                             p_Var7[iVar12].o.thr_bri.target_stone_id);
                  break;
                case Action_Terminal:
                case Action_Filter:
                  iVar11 = prVar22->proto_action_id;
                  p_Var7 = stone->proto_actions;
                  local_50 = (FMFormat)p_Var7[iVar11].o.term.handler;
                  p_Var6 = (attr_list)p_Var7[iVar11].o.term.client_data;
                  iVar12 = CMtrace_val[10];
                  if (cm->CMTrace_file == (FILE *)0x0) {
                    iVar12 = CMtrace_init(cm,EVerbose);
                  }
                  if (iVar12 != 0) {
                    if (CMtrace_PID != 0) {
                      pFVar5 = (FILE *)cm->CMTrace_file;
                      _Var13 = getpid();
                      local_40 = (long)_Var13;
                      pVar19 = pthread_self();
                      fprintf(pFVar5,"P%lxT%lx - ",local_40,pVar19);
                    }
                    if (CMtrace_timing != 0) {
                      clock_gettime(1,(timespec *)&local_80);
                      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_80.prev,
                              local_80.thread_id);
                    }
                    fwrite("Executing terminal/filter event\n",0x20,1,(FILE *)cm->CMTrace_file);
                  }
                  act = p_Var7 + iVar11;
                  fflush((FILE *)cm->CMTrace_file);
                  update_event_length_sum(cm,act,(event_item *)p_Var17);
                  pqVar18 = (queue_item *)INT_CMmalloc(0x18);
                  pqVar18->item = (event_item *)p_Var17;
                  p_Var9 = cm->evp;
                  pqVar18->next = p_Var9->current_event_list;
                  p_Var9->current_event_list = pqVar18;
                  stone->is_processing = 1;
                  if ((act->data_state == Requires_Contig_Encoded) &&
                     (*(int *)((long)&p_Var17->transports + 4) == 0)) {
                    encode_event(p_Var17,(event_item *)p_Var17);
                  }
                  local_80.stone_id = stone->local_id;
                  p_Var9 = cm->evp;
                  pVar19 = pthread_self();
                  local_80.next = p_Var9->activation_stack;
                  if (local_80.next != (ev_handler_activation_ptr)0x0) {
                    (local_80.next)->prev = &local_80;
                  }
                  local_80.prev = (_ev_handler_activation_rec *)0x0;
                  p_Var9->activation_stack = &local_80;
                  local_80.thread_id = pVar19;
                  IntCManager_unlock(cm,
                                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                                     ,0x725);
                  if (*(int *)((long)&p_Var17->transports + 4) == 0) {
                    iVar11 = (*(code *)local_50)(cm,p_Var17->control_list,p_Var6,
                                                 *(undefined8 *)&p_Var17->reg_user_format_count);
                  }
                  else {
                    in_R8 = *(char **)&p_Var17->reg_user_format_count;
                    iVar11 = (*(act->o).term.handler)
                                       (cm,p_Var17->control_module_choice,
                                        *(void **)&p_Var17->CManager_ID,p_Var6);
                  }
                  IntCManager_lock(cm,
                                   "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                                   ,0x72e);
                  rec = (ev_handler_activation_ptr)(ulong)(uint)s;
                  stone = stone_struct(cm->evp,s);
                  pop_activation_record_from_stack(cm,rec);
                  stone->is_processing = 0;
                  pqVar18 = cm->evp->current_event_list;
                  if ((CManager_conflict)pqVar18->item == p_Var17) {
                    cm->evp->current_event_list = pqVar18->next;
LAB_001344df:
                    free(pqVar18);
                  }
                  else {
                    p_Var25 = (CManager_conflict)pqVar18->item;
                    while (pqVar21 = pqVar18, pqVar18 = pqVar21, p_Var25 != p_Var17) {
                      pqVar18 = pqVar21->next;
                      local_38 = pqVar21;
                      if (pqVar18 == (queue_item *)0x0) {
                        pqVar18 = (queue_item *)0x0;
                        break;
                      }
                      p_Var25 = (CManager_conflict)pqVar18->item;
                    }
                    if (pqVar18 != (queue_item *)0x0) {
                      local_38->next = pqVar18->next;
                      goto LAB_001344df;
                    }
                    puts("Failed to dequeue item from executing events list!");
                  }
                  if (prVar22->action_type == Action_Filter) {
                    if (iVar11 == 0) {
                      iVar11 = CMtrace_val[10];
                      if (cm->CMTrace_file == (FILE *)0x0) {
                        iVar11 = CMtrace_init(cm,EVerbose);
                      }
                      if (iVar11 != 0) {
                        if (CMtrace_PID != 0) {
                          pFVar5 = (FILE *)cm->CMTrace_file;
                          _Var13 = getpid();
                          fprintf(pFVar5,"P%lxT%lx - ",(long)_Var13,pVar19);
                        }
                        if (CMtrace_timing != 0) {
                          clock_gettime(1,&local_60);
                          fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_60.tv_sec,
                                  local_60.tv_nsec);
                        }
                        fwrite("Filter discarded event\n",0x17,1,(FILE *)cm->CMTrace_file);
                      }
                      goto LAB_001349bc;
                    }
                    iVar11 = CMtrace_val[10];
                    if (cm->CMTrace_file == (FILE *)0x0) {
                      iVar11 = CMtrace_init(cm,EVerbose);
                    }
                    if (iVar11 != 0) {
                      if (CMtrace_PID != 0) {
                        pFVar5 = (FILE *)cm->CMTrace_file;
                        _Var13 = getpid();
                        fprintf(pFVar5,"P%lxT%lx - ",(long)_Var13,pVar19);
                      }
                      if (CMtrace_timing != 0) {
                        clock_gettime(1,&local_60);
                        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_60.tv_sec,
                                local_60.tv_nsec);
                      }
                      fprintf((FILE *)cm->CMTrace_file,
                              "Filter passed event to stone %x, submitting\n",
                              (ulong)(uint)(act->o).term.target_stone_id);
                    }
                    fflush((FILE *)cm->CMTrace_file);
                    p_Var25 = cm;
                    internal_path_submit(cm,(act->o).term.target_stone_id,(event_item *)p_Var17);
                    local_b4 = local_b4 + 1;
                  }
                  else {
                    iVar11 = CMtrace_val[10];
                    if (cm->CMTrace_file == (FILE *)0x0) {
                      iVar11 = CMtrace_init(cm,EVerbose);
                    }
                    if (iVar11 != 0) {
                      if (CMtrace_PID != 0) {
                        pFVar5 = (FILE *)cm->CMTrace_file;
                        _Var13 = getpid();
                        fprintf(pFVar5,"P%lxT%lx - ",(long)_Var13,pVar19);
                      }
                      if (CMtrace_timing != 0) {
                        clock_gettime(1,&local_60);
                        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_60.tv_sec,
                                local_60.tv_nsec);
                      }
                      fwrite("Finish terminal event\n",0x16,1,(FILE *)cm->CMTrace_file);
                    }
LAB_001349bc:
                    p_Var25 = (CManager_conflict)cm->CMTrace_file;
                    fflush((FILE *)p_Var25);
                  }
                  return_event((event_path_data)p_Var25,(event_item *)p_Var17);
                  goto LAB_001349d0;
                case Action_Immediate:
                  iVar11 = local_48[1];
                  p_Var8 = (prVar22->o).imm.handler;
                  p_Var20 = (prVar22->o).decode.target_reference_format;
                  in_R8 = (char *)(ulong)(uint)stone->output_count;
                  stone->is_processing = 1;
                  (*p_Var8)(cm,(_event_item *)p_Var17,p_Var20,
                            *(attr_list *)&p_Var17->reg_user_format_count,stone->output_count,
                            stone->output_stone_ids);
                  evp_00 = cm->evp;
                  stone = stone_struct(evp_00,s);
                  stone->is_processing = 0;
                  return_event(evp_00,(event_item *)p_Var17);
                  local_b4 = local_b4 + (uint)(iVar11 < local_48[1]);
LAB_001349d0:
                  bVar27 = true;
                  break;
                default:
                  __assert_fail("FALSE",
                                "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                                ,0x796,"int process_events_stone(CManager, int, action_class)");
                case Action_Split:
                  p_Var25 = cm;
                  update_event_length_sum
                            (cm,stone->proto_actions + prVar22->proto_action_id,
                             (event_item *)p_Var17);
                  if (0 < stone->output_count) {
                    lVar23 = 0;
                    do {
                      if (stone->output_stone_ids[lVar23] != -1) {
                        p_Var25 = cm;
                        internal_path_submit
                                  (cm,stone->output_stone_ids[lVar23],(event_item *)p_Var17);
                        local_b4 = local_b4 + 1;
                      }
                      lVar23 = lVar23 + 1;
                    } while (lVar23 < stone->output_count);
                  }
                  return_event((event_path_data)p_Var25,(event_item *)p_Var17);
                  break;
                case Action_Store:
                  p_Var7 = stone->proto_actions;
                  iVar11 = prVar22->proto_action_id;
                  (**(code **)(p_Var7[iVar11].o.bri.remote_contact + 0x10))(cm);
                  iVar12 = CMtrace_val[10];
                  if (cm->CMTrace_file == (FILE *)0x0) {
                    iVar12 = CMtrace_init(cm,EVerbose);
                  }
                  if (iVar12 != 0) {
                    if (CMtrace_PID != 0) {
                      pFVar5 = (FILE *)cm->CMTrace_file;
                      _Var13 = getpid();
                      pVar19 = pthread_self();
                      fprintf(pFVar5,"P%lxT%lx - ",(long)_Var13,pVar19);
                    }
                    if (CMtrace_timing != 0) {
                      clock_gettime(1,(timespec *)&local_80);
                      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_80.prev,
                              local_80.thread_id);
                    }
                    fwrite("Enqueued item to store\n",0x17,1,(FILE *)cm->CMTrace_file);
                  }
                  fflush((FILE *)cm->CMTrace_file);
                  iVar12 = p_Var7[iVar11].o.store.max_stored;
                  iVar3 = p_Var7[iVar11].o.term.target_stone_id;
                  p_Var7[iVar11].o.term.target_stone_id = iVar3 + 1;
                  if (iVar12 != -1 && iVar12 <= iVar3) {
                    iVar12 = CMtrace_val[10];
                    if (cm->CMTrace_file == (FILE *)0x0) {
                      iVar12 = CMtrace_init(cm,EVerbose);
                    }
                    if (iVar12 != 0) {
                      if (CMtrace_PID != 0) {
                        pFVar5 = (FILE *)cm->CMTrace_file;
                        _Var13 = getpid();
                        pVar19 = pthread_self();
                        fprintf(pFVar5,"P%lxT%lx - ",(long)_Var13,pVar19);
                      }
                      if (CMtrace_timing != 0) {
                        clock_gettime(1,(timespec *)&local_80);
                        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_80.prev,
                                local_80.thread_id);
                      }
                      fwrite("Dequeuing item because of limit\n",0x20,1,(FILE *)cm->CMTrace_file);
                    }
                    fflush((FILE *)cm->CMTrace_file);
                    peVar15 = (event_item *)
                              (**(code **)(p_Var7[iVar11].o.bri.remote_contact + 0x18))
                                        (cm,(undefined1 *)((long)&p_Var7[iVar11].o + 0x18));
                    if (peVar15->ref_count < 1) {
                      __assert_fail("last_event->ref_count > 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                                    ,0x785,"int process_events_stone(CManager, int, action_class)");
                    }
                    piVar1 = &p_Var7[iVar11].o.term.target_stone_id;
                    *piVar1 = *piVar1 + -1;
                    p_Var17 = cm;
                    internal_path_submit(cm,p_Var7[iVar11].o.thr_bri.target_stone_id,peVar15);
                    return_event((event_path_data)p_Var17,peVar15);
                    local_b4 = local_b4 + 1;
                  }
                }
                iVar11 = 0;
                pqVar21 = pqVar4;
LAB_0013412c:
                if ((iVar11 != 0) && (iVar11 != 2)) {
                  if (iVar11 != 3) {
                    return iVar26;
                  }
                  break;
                }
                pqVar18 = pqVar21;
              } while (pqVar21 != (queue_item *)0x0);
              bVar27 = !bVar27;
            }
            if (!bVar27) {
              stone->new_enqueue_flag = 0;
            }
          }
        }
      }
    }
  }
  return local_b4;
}

Assistant:

static int
process_events_stone(CManager cm, int s, action_class c)
{

/*  Process all possible events on this stone that match the class */

    event_path_data evp = cm->evp;
    stone_type stone = NULL;
    int more_pending = 0;
    int did_something = 0;
    queue_item *item;
    action_state as = evp->as;


    if (s == -1) return 0;
    if (as->last_active_stone == s) as->last_active_stone = -1;
    stone = stone_struct(cm->evp, s);
    if (!stone) return 0;
    if (stone->queue_size == 0) return 0;
    if (CMtrace_on(cm, EVerbose)) {
	fprintf(cm->CMTrace_file, "Considering events on ");
	fprint_stone_identifier(cm->CMTrace_file, evp, s);
	fprintf(cm->CMTrace_file, "\n");
    }
    if (stone->local_id == -1) return 0;
    if (stone->is_draining == 2) return 0;
    if (stone->is_frozen == 1) return 0;
    if (c == Immediate_and_Multi && stone->pending_output) {
        more_pending += process_stone_pending_output(cm, s);
    }
    if (is_bridge_stone(cm, s) && (c != Bridge) && (c != Congestion)) return 0;
    
    if (CMtrace_on(cm, EVerbose)) {
	fprintf(cm->CMTrace_file, "Process events ");
	fprint_stone_identifier(cm->CMTrace_file, evp, s);
	fprintf(cm->CMTrace_file, "\n");
    }
    item = stone->queue->queue_head;
    if (is_bridge_stone(cm, s) && (c == Bridge)) {
	stone->is_processing = 1;
	do_bridge_action(cm, s);
	stone->is_processing = 0;
	return 0;
    }
    while (item != NULL && stone->is_draining == 0 && stone->is_frozen == 0) {
	queue_item *next = item->next;
	response_cache_element *resp;
	response_cache_element *act = NULL;
	if (item->handled) {
	    item = next;
	    continue;
	} else {
	    /* determine what kind of action to take here */
	    int resp_id;
	    event_item *event = item->item;
	    resp_id = determine_action(cm, stone, c, item->item, 0);
            assert(resp_id < stone->response_cache_count);
	    if (stone->response_cache[resp_id].action_type == Action_NoAction
                && c == Immediate_and_Multi) {
                /* ignore event */
                char *tmp = NULL;
                if (event->reference_format)
                    tmp = global_name_of_FMFormat(event->reference_format);
                printf("No action found for event %p submitted to \n", event);
		print_stone_identifier(evp, s);
		printf("\n");
                dump_stone(stone_struct(evp, s));
                if (tmp != NULL) {
                    static int first = 1;
                    printf("    Unhandled incoming event format was \"%s\"\n", tmp);
                    if (first) {
                        first = 0;
                        printf("\n\t** use \"format_info <format_name>\" to get full format information ** \n\n");
                    }
                } else {
                    printf("    Unhandled incoming event format was NULL\n");
                }
                if (tmp) free(tmp);
                event = dequeue_item(cm, stone, item);
                return_event(evp, event);
            }
	    resp = &stone->response_cache[resp_id];
	    if (resp->action_type == Action_Decode) {
		event_item *event_to_submit;
		if (!event->event_encoded) {
		    event_item *old_data_event;
		    CMtrace_out(cm, EVerbose, "Encoding event prior to decode for conversion, action id %d\n", resp_id);
		    old_data_event = reassign_memory_event(cm, event, 0);  /* reassign memory */
		    return_event(evp, old_data_event);
		    event->ref_count++;
		}
		CMtrace_out(cm, EVerbose, "Decoding event, action id %d\n", resp_id);
		event_to_submit = decode_action(cm, event, resp);
		if (event_to_submit == NULL) return more_pending;
		item->item = event_to_submit;
		resp_id = determine_action(cm, stone, c, event_to_submit, 0);
		resp = &stone->response_cache[resp_id];
	    }
	    if (CMtrace_on(cm, EVerbose)) {
		fprintf(cm->CMTrace_file, "next action event %p on ", event);
		fprint_stone_identifier(cm->CMTrace_file, evp, s);
		fprintf(cm->CMTrace_file, " action type is %s, reference_format is %p (%s), stage is %d, requires_decoded is %d\n",
			action_str[resp->action_type], resp->reference_format, 
			resp->reference_format ? global_name_of_FMFormat(resp->reference_format) : "<none>",
			resp->stage, resp->requires_decoded);
		fdump_action(cm->CMTrace_file, stone, resp, resp->proto_action_id, "    ");
	    }
            act = &stone->response_cache[resp_id];
	}
        backpressure_check(cm, s);
        if (!compatible_stages(c, act->stage)) {
	    /* do nothing */
        } else if (is_immediate_action(act)) {
	    event_item *event = dequeue_item(cm, stone, item);
	    ev_handler_activation_rec act_rec;
	    switch(act->action_type) {
	    case Action_Terminal:
	    case Action_Filter: {
		/* the data should already be in the right format */
		int proto = act->proto_action_id;
		proto_action *p = &stone->proto_actions[proto];
		int out;
		struct terminal_proto_vals *term = &(p->o.term);
		EVSimpleHandlerFunc handler = term->handler;
		void *client_data = term->client_data;
		CMtrace_out(cm, EVerbose, "Executing terminal/filter event\n");
		update_event_length_sum(cm, p, event);
		{
		    queue_item *new = malloc(sizeof(queue_item));
		    new->item = event;
		    new->next = cm->evp->current_event_list;
		    cm->evp->current_event_list = new;
		}
		did_something=1;
		stone->is_processing = 1;
		if ((p->data_state == Requires_Contig_Encoded) && 
		    (event->event_encoded == 0)) {
		    encode_event(cm, event);
		}
		act_rec.stone_id = stone->local_id;
		push_activation_record_on_stack(cm, &act_rec);
		CManager_unlock(cm);
		if (event->event_encoded == 0) {
		    out = (handler)(cm, event->decoded_event, client_data,
				    event->attrs);
		} else {
		    EVRawHandlerFunc han = (EVRawHandlerFunc)term->handler;
		    out = (han)(cm, event->encoded_event, event->event_len,
				    client_data, event->attrs);
		}
		CManager_lock(cm);
		stone = stone_struct(cm->evp, s);
		pop_activation_record_from_stack(cm, &act_rec);
		stone->is_processing = 0;
		{
		    if (cm->evp->current_event_list->item == event) {
			queue_item *tmp = cm->evp->current_event_list;
			cm->evp->current_event_list = tmp->next;
			free(tmp);
		    } else {
			queue_item *tmp = cm->evp->current_event_list;
			queue_item *last;
			while(tmp->item != event) {
			    last = tmp;
			    tmp = tmp->next;
			    if (tmp == NULL) break;
			}
			if (tmp == NULL) {
			    printf("Failed to dequeue item from executing events list!\n");
			} else {
			    last->next = tmp->next;
			    free(tmp);
			}
		    }
		}

		if (act->action_type == Action_Filter) {
		    if (out) {
			CMtrace_out(cm, EVerbose, "Filter passed event to stone %x, submitting\n", term->target_stone_id);
			internal_path_submit(cm, 
					     term->target_stone_id,
					     event);
			more_pending++;
		    } else {
			CMtrace_out(cm, EVerbose, "Filter discarded event\n");
		    }			    
		} else {
		    CMtrace_out(cm, EVerbose, "Finish terminal event\n");
		}
		return_event(evp, event);
		break;
	    }
	    case Action_Split: {
		int t = 0;
		proto_action *p = &stone->proto_actions[act->proto_action_id];
		update_event_length_sum(cm, p, event);
		for (t=0; t < stone->output_count; t++) {
		    if (stone->output_stone_ids[t] != -1) {
			internal_path_submit(cm, 
					     stone->output_stone_ids[t],
					     event);
			more_pending++;
		    }
		}
		return_event(evp, event);
		break;
	    }
	    case Action_Immediate: {
		EVImmediateHandlerFunc func;
		void *client_data;
		int *out_stones;
		int out_count;
		int in_play = as->events_in_play;
		/* data is already in the right format */
		func = act->o.imm.handler;
		client_data = act->o.imm.client_data;
		out_stones = stone->output_stone_ids;
		out_count = stone->output_count;
		did_something = 1;
		stone->is_processing = 1;
		func(cm, event, client_data, event->attrs, out_count, out_stones);
		stone = stone_struct(cm->evp, s);
		stone->is_processing = 0;
		return_event(evp, event);
		if (as->events_in_play > in_play)
		    more_pending++;   /* maybe??? */
		break;
	    }
            case Action_Store: {
		proto_action *p = &stone->proto_actions[act->proto_action_id];
                storage_queue_enqueue(cm, &p->o.store.queue, event);
                CMtrace_out(cm, EVerbose, "Enqueued item to store\n");
                if (++p->o.store.num_stored > p->o.store.max_stored
                        && p->o.store.max_stored != -1) {
                    CMtrace_out(cm, EVerbose, "Dequeuing item because of limit\n");
                    event_item *last_event;
                    last_event = storage_queue_dequeue(cm, &p->o.store.queue);
                    assert(last_event->ref_count > 0);
                    --p->o.store.num_stored;
                    internal_path_submit(cm, p->o.store.target_stone_id, last_event);
                    return_event(evp, last_event);
                    more_pending++;
                }
                break;
            }
	    case Action_Thread_Bridge: {
		proto_action *p = &stone->proto_actions[act->proto_action_id];
		if (p->o.thr_bri.target_cm_shutdown) continue;
                thread_bridge_transfer(cm, event, p->o.thr_bri.target_cm,
				       p->o.thr_bri.target_stone_id);
		break;
	    }
	    case Action_Bridge:
	    default:
		assert(FALSE);
	    }
	} else if (is_multi_action(act) || is_congestion_action(act)) {
	    /* event_item *event = dequeue_item(cm, stone->queue, item); XXX */
	    if (stone->new_enqueue_flag) {
		if (!item->handled) {
		    did_something = 1;
		    stone->is_processing = 1;
		    item->handled = 1;
		    if ((act->o.multi.handler)(cm, stone->queue, item,
					       act->o.multi.client_data, stone->output_count,
					       stone->output_stone_ids))
			more_pending++;
		    stone = stone_struct(cm->evp, s);
		    stone->is_processing = 0;
		}
	    }
            break;    
	} 
	item = next;
    }
    if (did_something) {
	stone->new_enqueue_flag = 0;
    }
    return more_pending;
}